

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

void wabt::WriteDoubleHex(char *buffer,size_t size,uint64_t bits)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 *puVar8;
  byte *pbVar9;
  char *pcVar10;
  size_t __n;
  undefined1 local_48 [8];
  char buffer_1 [40];
  
  uVar4 = (uint)(bits >> 0x34) & 0x7ff;
  uVar3 = uVar4 - 0x3ff;
  if ((long)bits < 0) {
    puVar8 = (undefined4 *)(local_48 + 1);
    local_48[0] = 0x2d;
  }
  else {
    puVar8 = (undefined4 *)local_48;
  }
  uVar6 = bits & 0xfffffffffffff;
  if (uVar3 == 0x400) {
    pbVar9 = (byte *)((long)puVar8 + 3);
    if (uVar6 == 0) {
      *puVar8 = 0x666e69;
    }
    else {
      *puVar8 = 0x6e616e;
      if (uVar6 != 0x8000000000000) {
        pbVar9[0] = 0x3a;
        pbVar9[1] = 0x30;
        pbVar9[2] = 0x78;
        pbVar9[3] = 0;
        iVar2 = -0x10;
        do {
          uVar7 = uVar6 << 4;
          uVar5 = uVar6 >> 0x38;
          iVar2 = iVar2 + 1;
          uVar6 = uVar7;
        } while (uVar5 == 0);
        pbVar9 = (byte *)((long)puVar8 + 6);
        for (; iVar2 != 0; iVar2 = iVar2 + 1) {
          *pbVar9 = "0123456789abcdef"[uVar7 >> 0x3c];
          pbVar9 = pbVar9 + 1;
          uVar7 = uVar7 << 4;
        }
      }
    }
  }
  else {
    *(undefined2 *)puVar8 = 0x7830;
    *(byte *)((long)puVar8 + 2) = (uVar4 == 0 && uVar6 == 0) ^ 0x31;
    if (uVar6 == 0) {
      pcVar10 = (char *)((long)puVar8 + 3);
    }
    else {
      uVar7 = uVar6 << 0xc;
      if (uVar4 == 0) {
        uVar5 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = uVar5 ^ 0x3f;
        uVar7 = uVar7 << ((char)uVar5 + 1U & 0x3f);
        if (uVar5 == 0x3f) {
          uVar7 = 0;
        }
        uVar3 = -(int)uVar5 - 0x3ff;
      }
      *(undefined1 *)((long)puVar8 + 3) = 0x2e;
      pcVar10 = (char *)(puVar8 + 1);
      for (; uVar7 != 0; uVar7 = uVar7 << 4) {
        *pcVar10 = "0123456789abcdef"[uVar7 >> 0x3c];
        pcVar10 = pcVar10 + 1;
      }
    }
    pcVar1 = pcVar10 + 1;
    *pcVar10 = 'p';
    if (uVar4 == 0 && uVar6 == 0) {
      pcVar10[3] = '\0';
      pcVar1[0] = '+';
      pcVar1[1] = '0';
      pbVar9 = (byte *)(pcVar10 + 3);
    }
    else {
      if ((int)uVar3 < 0) {
        *pcVar1 = '-';
        uVar3 = -uVar3;
      }
      else {
        *pcVar1 = '+';
      }
      if ((int)uVar3 < 1000) {
        pbVar9 = (byte *)(pcVar10 + 2);
      }
      else {
        pcVar10[2] = '1';
        pbVar9 = (byte *)(pcVar10 + 3);
      }
      if (99 < (int)uVar3) {
        *pbVar9 = (char)(uVar3 / 100) + (char)(((ulong)uVar3 / 100) * 0x1999999a >> 0x20) * -10 |
                  0x30;
        pbVar9 = pbVar9 + 1;
      }
      if (9 < (int)uVar3) {
        *pbVar9 = (char)(uVar3 / 10) + (char)(((ulong)uVar3 / 10) * 0x1999999a >> 0x20) * -10 | 0x30
        ;
        pbVar9 = pbVar9 + 1;
      }
      *pbVar9 = (char)uVar3 +
                ((char)(uint)((ulong)((long)(int)uVar3 * 0x66666667) >> 0x22) -
                (char)((int)uVar3 >> 0x1f)) * -10 + 0x30;
      pbVar9 = pbVar9 + 1;
    }
  }
  uVar6 = (long)pbVar9 - (long)local_48;
  __n = size - 1;
  if (uVar6 < size) {
    __n = uVar6;
  }
  memcpy(buffer,local_48,__n);
  buffer[__n] = '\0';
  return;
}

Assistant:

void WriteDoubleHex(char* buffer, size_t size, uint64_t bits) {
  return FloatWriter<double>::WriteHex(buffer, size, bits);
}